

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char*,char_const(&)[2],kj::String&>
          (String *__return_storage_ptr__,kj *this,char **params,char (*params_1) [2],
          String *params_2)

{
  char *pcVar1;
  ArrayPtr<const_char> local_50;
  char *local_40;
  size_t local_38;
  ArrayPtr<const_char> local_30;
  
  pcVar1 = *(char **)this;
  local_38 = strlen(pcVar1);
  local_40 = pcVar1;
  local_50.size_ = strlen((char *)params);
  pcVar1 = *(char **)(params_1 + 4);
  local_30.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_30.ptr = *(char **)params_1;
  }
  local_30.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_30.size_ = (size_t)(pcVar1 + -1);
  }
  local_50.ptr = (char *)params;
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_40,&local_50,&local_30,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}